

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::ParseLiteralNoAST
          (Parser<UTF8EncodingPolicyBase<false>,_true> *this,EncodedChar *input,
          EncodedChar *inputLim,CharCount *outBodyEncodedChars,CharCount *outTotalEncodedChars,
          CharCount *outBodyChars,CharCount *outTotalChars)

{
  code *pcVar1;
  CharCount CVar2;
  CharCount CVar3;
  HRESULT HVar4;
  bool bVar5;
  undefined4 *puVar6;
  ParseError *pPVar7;
  long lVar8;
  ulong uVar9;
  RegexFlags local_31 [8];
  RegexFlags dummyFlags;
  
  if (input == (EncodedChar *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xb7c,"(input != 0)","input != 0");
    if (!bVar5) goto LAB_00ef1df8;
    *puVar6 = 0;
  }
  if (inputLim < input) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xb7d,"(inputLim >= input)","inputLim >= input");
    if (!bVar5) goto LAB_00ef1df8;
    *puVar6 = 0;
  }
  this->input = input;
  this->inputLim = inputLim;
  this->next = input;
  this->inBody = true;
  (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits = 0;
  this->positionAfterLastSurrogate = (EncodedChar *)0x0;
  this->deferredIfNotUnicodeError = (ParseError *)0x0;
  this->deferredIfUnicodeError = (ParseError *)0x0;
  DisjunctionPass0(this,0);
  lVar8 = (long)this->next - (long)input;
  if (this->next < input || 0x7ffffffe < lVar8) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                       ,0x37,"(ph >= pl && ph - pl <= MaxCharCount)",
                       "ph >= pl && ph - pl <= MaxCharCount");
    if (!bVar5) goto LAB_00ef1df8;
    *puVar6 = 0;
  }
  *outBodyEncodedChars = (CharCount)lVar8;
  uVar9 = (long)this->next - (long)this->input;
  if (this->next < this->input || 0x7ffffffe < (long)uVar9) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                       ,0x37,"(ph >= pl && ph - pl <= MaxCharCount)",
                       "ph >= pl && ph - pl <= MaxCharCount");
    if (!bVar5) goto LAB_00ef1df8;
    *puVar6 = 0;
  }
  if ((uVar9 & 0xffffffff) < (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xb0,"(nextOffset >= this->m_cMultiUnits)",
                       "nextOffset >= this->m_cMultiUnits");
    if (!bVar5) goto LAB_00ef1df8;
    *puVar6 = 0;
  }
  *outBodyChars = (int)uVar9 - (int)(this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits;
  ECMust(this,'/',-0x7ff5fc0c);
  local_31[0] = NoRegexFlags;
  Options(this,local_31);
  this->unicodeFlagPresent = (bool)(local_31[0] >> 3 & 1);
  this->caseInsensitiveFlagPresent = (bool)(local_31[0] & IgnoreCaseRegexFlag);
  this->dotAllFlagPresent = (bool)(local_31[0] >> 5 & 1);
  lVar8 = (long)this->next - (long)input;
  if (this->next < input || 0x7ffffffe < lVar8) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                       ,0x37,"(ph >= pl && ph - pl <= MaxCharCount)",
                       "ph >= pl && ph - pl <= MaxCharCount");
    if (!bVar5) goto LAB_00ef1df8;
    *puVar6 = 0;
  }
  *outTotalEncodedChars = (CharCount)lVar8;
  uVar9 = (long)this->next - (long)this->input;
  if (this->next < this->input || 0x7ffffffe < (long)uVar9) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                       ,0x37,"(ph >= pl && ph - pl <= MaxCharCount)",
                       "ph >= pl && ph - pl <= MaxCharCount");
    if (!bVar5) goto LAB_00ef1df8;
    *puVar6 = 0;
  }
  if ((uVar9 & 0xffffffff) < (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xb0,"(nextOffset >= this->m_cMultiUnits)",
                       "nextOffset >= this->m_cMultiUnits");
    if (!bVar5) {
LAB_00ef1df8:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  *outTotalChars = (int)uVar9 - (int)(this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits;
  if ((this->deferredIfNotUnicodeError == (ParseError *)0x0) || (this->unicodeFlagPresent != false))
  {
    if ((this->deferredIfUnicodeError == (ParseError *)0x0) || (this->unicodeFlagPresent != true)) {
      return;
    }
    puVar6 = (undefined4 *)__cxa_allocate_exception(0x10);
    pPVar7 = this->deferredIfUnicodeError;
  }
  else {
    puVar6 = (undefined4 *)__cxa_allocate_exception(0x10);
    pPVar7 = this->deferredIfNotUnicodeError;
  }
  CVar2 = pPVar7->pos;
  CVar3 = pPVar7->encodedPos;
  HVar4 = pPVar7->error;
  *puVar6 = *(undefined4 *)pPVar7;
  puVar6[1] = CVar2;
  puVar6[2] = CVar3;
  puVar6[3] = HVar4;
  __cxa_throw(puVar6,&ParseError::typeinfo,0);
}

Assistant:

void Parser<P, IsLiteral>::ParseLiteralNoAST
        ( const EncodedChar* input
        , const EncodedChar* inputLim
        , CharCount& outBodyEncodedChars
        , CharCount& outTotalEncodedChars
        , CharCount& outBodyChars
        , CharCount& outTotalChars )
    {
        Assert(IsLiteral);
        Assert(input != 0);
        Assert(inputLim >= input); // *inputLim need not be 0 because of deferred parsing

        // Body, pass 0
        SetPosition(input, inputLim, true);
        PatternPass0();
        outBodyEncodedChars = Chars<EncodedChar>::OSB(next, input);
        outBodyChars = Pos();

        // Options
        ECMust('/', ERRnoSlash);
        RegexFlags dummyFlags = NoRegexFlags;
        Options(dummyFlags);
        this->unicodeFlagPresent = (dummyFlags & UnifiedRegex::UnicodeRegexFlag) == UnifiedRegex::UnicodeRegexFlag;
        this->caseInsensitiveFlagPresent = (dummyFlags & UnifiedRegex::IgnoreCaseRegexFlag) == UnifiedRegex::IgnoreCaseRegexFlag;
        this->dotAllFlagPresent = (dummyFlags & UnifiedRegex::DotAllRegexFlag) == UnifiedRegex::DotAllRegexFlag;
        outTotalEncodedChars = Chars<EncodedChar>::OSB(next, input);
        outTotalChars = Pos();

        // If this HR has been set, that means we have an earlier failure than the one caught above.
        if (this->deferredIfNotUnicodeError != nullptr && !this->unicodeFlagPresent)
        {
            throw ParseError(*deferredIfNotUnicodeError);
        }
        else if(this->deferredIfUnicodeError != nullptr && this->unicodeFlagPresent)
        {
            throw ParseError(*deferredIfUnicodeError);
        }
    }